

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O0

void __thiscall TPZIntQuad::Point(TPZIntQuad *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  ostream *poVar4;
  void *this_00;
  double *in_RCX;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  int ie;
  int ik;
  
  if ((((in_RDI[3] != 0) && (in_RDI[2] != 0)) && (-1 < in_ESI)) &&
     (iVar1 = (**(code **)(*in_RDI + 0x18))(), in_ESI < iVar1)) {
    iVar1 = in_ESI;
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    iVar2 = TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    iVar2 = in_ESI / iVar2;
    TPZGaussRule::NInt((TPZGaussRule *)in_RDI[3]);
    TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(in_ESI,iVar2),iVar1);
    pdVar3 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar3 = (double)in_ST0;
    TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(in_ESI,iVar2),iVar1);
    pdVar3 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar3 = (double)in_ST1;
    TPZGaussRule::W((TPZGaussRule *)CONCAT44(in_ESI,iVar2),iVar1);
    TPZGaussRule::W((TPZGaussRule *)CONCAT44(in_ESI,iVar2),iVar1);
    *in_RCX = (double)(in_ST2 * in_ST3);
    return;
  }
  if ((in_RDI[2] == 0) || (in_RDI[3] == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Null Pointer passed to method ");
    std::operator<<(poVar4,"TPZInt1d::TPZInt1d(TPZGaussRule *)\n");
  }
  if ((-1 < in_ESI) && (iVar1 = (**(code **)(*in_RDI + 0x18))(), in_ESI < iVar1)) {
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ip = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
  poVar4 = std::operator<<(poVar4,", Out of Range: 0 -> ");
  iVar1 = (**(code **)(*in_RDI + 0x18))();
  this_00 = (void *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZIntQuad::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
    
#ifdef PZDEBUG
    if(pos.size() == 1 || pos.size() > 3 )
    {
        DebugStop();
    }
#endif
	if((fIntEta) && (fIntKsi) && ((ip >= 0) && (ip < NPoints()))){
		int ik, ie;
		ik = ip/fIntEta->NInt();
		ie = ip - (ip/fIntEta->NInt())*(fIntEta->NInt());
		pos[0] = fIntKsi->Loc(ik);
		pos[1] = fIntEta->Loc(ie);
		w      = fIntKsi->W(ik)*fIntEta->W(ie);
		return;
	}
	if(!fIntKsi || !fIntEta)
		PZError 	<< "Null Pointer passed to method " << "TPZInt1d::TPZInt1d(TPZGaussRule *)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}